

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

u32 irr::core::strtoul10(char *in,char **out)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  
  if (in == (char *)0x0) {
    uVar1 = 0;
    uVar2 = 0;
    if (out != (char **)0x0) {
      in = (char *)0x0;
      goto LAB_001da1dc;
    }
  }
  else {
    bVar3 = false;
    uVar1 = 0;
    for (; (byte)(*in - 0x30U) < 10; in = in + 1) {
      uVar4 = (uint)(byte)(*in - 0x30U) + uVar1 * 10;
      uVar2 = uVar4;
      if (bVar3) {
        uVar2 = uVar1;
      }
      bVar5 = uVar4 < uVar1;
      uVar1 = uVar2;
      if (bVar5) {
        uVar1 = 0xffffffff;
      }
      bVar3 = (bool)(bVar3 | bVar5);
    }
    uVar2 = uVar1;
    if (out != (char **)0x0) {
LAB_001da1dc:
      *out = in;
      return uVar2;
    }
  }
  return uVar1;
}

Assistant:

inline u32 strtoul10(const char *in, const char **out = 0)
{
	if (!in) {
		if (out)
			*out = in;
		return 0;
	}

	bool overflow = false;
	u32 unsignedValue = 0;
	while ((*in >= '0') && (*in <= '9')) {
		const u32 tmp = (unsignedValue * 10) + (*in - '0');
		if (tmp < unsignedValue) {
			unsignedValue = (u32)0xffffffff;
			overflow = true;
		}
		if (!overflow)
			unsignedValue = tmp;
		++in;
	}

	if (out)
		*out = in;

	return unsignedValue;
}